

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::LightningGroup> *
metaf::LightningGroup::fromLtgGroup
          (optional<metaf::LightningGroup> *__return_storage_ptr__,string *group)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> currType;
  
  bVar3 = std::operator==(group,"LTG");
  if (bVar3) {
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::LightningGroup>._M_payload = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0xc) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeUnknown = false;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x10) = 0;
  }
  else {
    if (group->_M_string_length < 3) {
      bVar3 = false;
      goto LAB_0018cff2;
    }
    uVar8 = 0;
    bVar3 = false;
    uVar9 = 3;
    std::__cxx11::string::substr((ulong)&currType,(ulong)group);
    bVar4 = std::operator!=(&currType,"LTG");
    std::__cxx11::string::~string((string *)&currType);
    if (bVar4) goto LAB_0018cff2;
    bVar1 = false;
    bVar6 = false;
    bVar4 = false;
    bVar7 = false;
    bVar3 = false;
    for (; (uVar9 < group->_M_string_length && (uVar8 < 6)); uVar8 = uVar8 + 1) {
      std::__cxx11::string::substr((ulong)&currType,(ulong)group);
      bVar5 = std::operator==(&currType,"IC");
      bVar2 = bVar1;
      if (bVar5) {
        bVar7 = true;
      }
      else {
        bVar5 = std::operator==(&currType,"CC");
        if (bVar5) {
          bVar4 = true;
        }
        else {
          bVar5 = std::operator==(&currType,"CG");
          if (bVar5) {
            bVar3 = true;
          }
          else {
            bVar5 = std::operator==(&currType,"CA");
            bVar2 = true;
            if (bVar5) {
              bVar6 = true;
              bVar2 = bVar1;
            }
          }
        }
      }
      bVar1 = bVar2;
      std::__cxx11::string::~string((string *)&currType);
      uVar9 = uVar9 + 2;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::LightningGroup>._M_payload = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0xc) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.dist.distUnit = METERS;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeCloudGround = bVar3;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeInCloud = bVar7;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeCloudCloud = bVar4;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeCloudAir = bVar6;
    (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.typeUnknown = bVar1;
  }
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
           _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x24) = 0;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
           _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x30) = 0;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
           _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x3c) = 0;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>).
           _M_payload.super__Optional_payload_base<metaf::LightningGroup>._M_payload + 0x48) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::LightningGroup>._M_payload._M_value.incomplete = false;
  bVar3 = true;
LAB_0018cff2:
  (__return_storage_ptr__->super__Optional_base<metaf::LightningGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::LightningGroup>._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LightningGroup> LightningGroup::fromLtgGroup(const std::string & group) {
	std::optional<LightningGroup> notRecognised;
	static const auto ltgLen = 3u; // length of string LTG
	static const char ltg[ltgLen + 1] = "LTG";

	LightningGroup result;
	if (group == ltg) return (result);

	if (group.length() < ltgLen) return notRecognised;
	if (group.substr(0, ltgLen) != ltg) return notRecognised;

	auto currPos = ltgLen;
	static const auto typeLen = 2;
	static const auto maxLightningTypeCount = 
		6; // arbitrary number greater than 4; well formed group can have max 4 types
	auto lightningTypeCount = 0;
	while(currPos < group.length() && lightningTypeCount < maxLightningTypeCount) {
		const auto currType = group.substr(currPos, typeLen);
		currPos += typeLen;
		lightningTypeCount++;
		if (currType == "IC") { result.typeInCloud = true; continue; }
		if (currType == "CC") { result.typeCloudCloud = true; continue; }
		if (currType == "CG") { result.typeCloudGround = true; continue; }
		if (currType == "CA") { result.typeCloudAir = true; continue; }
		result.typeUnknown = true;
	}
	return result;
}